

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

void xmlCtxtDumpOneNode(xmlDebugCtxtPtr ctxt,xmlNodePtr node)

{
  long lVar1;
  xmlEntityPtr pxVar2;
  FILE *pFVar3;
  xmlChar *pxVar4;
  undefined8 uVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  xmlElementType xVar9;
  _xmlAttr *attr;
  xmlNs *pxVar10;
  char local_13c8 [5000];
  undefined1 local_40;
  
  if (node == (xmlNodePtr)0x0) {
    if (ctxt->check != 0) {
      return;
    }
    xmlCtxtDumpSpaces(ctxt);
    pFVar3 = (FILE *)ctxt->output;
    pcVar8 = "node is NULL\n";
    sVar7 = 0xd;
    goto LAB_001670e8;
  }
  ctxt->node = node;
  xVar9 = node->type;
  switch(xVar9) {
  case XML_ELEMENT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fwrite("ELEMENT ",8,1,(FILE *)ctxt->output);
      if ((node->ns != (xmlNs *)0x0) && (pxVar4 = node->ns->prefix, pxVar4 != (xmlChar *)0x0)) {
        xmlCtxtDumpString(ctxt,pxVar4);
        fputc(0x3a,(FILE *)ctxt->output);
      }
      xmlCtxtDumpString(ctxt,node->name);
LAB_001676fc:
      pFVar3 = (FILE *)ctxt->output;
LAB_00167704:
      fputc(10,pFVar3);
    }
    break;
  case XML_ATTRIBUTE_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    pFVar3 = (FILE *)ctxt->output;
    pcVar8 = "Error, ATTRIBUTE found here\n";
    sVar7 = 0x1c;
    goto LAB_001672e4;
  case XML_TEXT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      if (node->name == "textnoenc") {
        pcVar8 = "TEXT no enc";
        sVar7 = 0xb;
      }
      else {
        pcVar8 = "TEXT";
        sVar7 = 4;
      }
      fwrite(pcVar8,sVar7,1,(FILE *)ctxt->output);
      if ((ctxt->options & 1) == 0) goto LAB_001676fc;
      if ((_xmlAttr **)node->content == &node->properties) {
        pFVar3 = (FILE *)ctxt->output;
        pcVar8 = " compact\n";
        goto LAB_00167146;
      }
      iVar6 = xmlDictOwns(ctxt->dict,node->content);
      pFVar3 = (FILE *)ctxt->output;
      if (iVar6 == 1) {
        pcVar8 = " interned\n";
        sVar7 = 10;
        goto LAB_00167359;
      }
      goto LAB_00167704;
    }
    break;
  case XML_CDATA_SECTION_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = "CDATA_SECTION\n";
LAB_00167312:
      sVar7 = 0xe;
LAB_00167359:
      fwrite(pcVar8,sVar7,1,pFVar3);
    }
    break;
  case XML_ENTITY_REF_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar3 = (FILE *)ctxt->output;
      pxVar4 = node->name;
      pcVar8 = "ENTITY_REF(%s)\n";
LAB_0016738b:
      fprintf(pFVar3,pcVar8,pxVar4);
    }
    break;
  case XML_ENTITY_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = "ENTITY\n";
      sVar7 = 7;
      goto LAB_00167359;
    }
    break;
  case XML_PI_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar3 = (FILE *)ctxt->output;
      pxVar4 = node->name;
      pcVar8 = "PI %s\n";
      goto LAB_0016738b;
    }
    break;
  case XML_COMMENT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = "COMMENT\n";
      sVar7 = 8;
      goto LAB_00167359;
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    pFVar3 = (FILE *)ctxt->output;
    pcVar8 = "Error, DOCUMENT found here\n";
    sVar7 = 0x1b;
LAB_001672e4:
    fwrite(pcVar8,sVar7,1,pFVar3);
    goto LAB_0016797c;
  case XML_DOCUMENT_TYPE_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = "DOCUMENT_TYPE\n";
      goto LAB_00167312;
    }
    break;
  case XML_DOCUMENT_FRAG_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = "DOCUMENT_FRAG\n";
      goto LAB_00167312;
    }
    break;
  case XML_NOTATION_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = "NOTATION\n";
LAB_00167146:
      sVar7 = 9;
      goto LAB_00167359;
    }
    break;
  case XML_DTD_NODE:
    xmlCtxtDumpDtdNode(ctxt,(xmlDtdPtr)node);
    return;
  case XML_ELEMENT_DECL:
    xmlCtxtDumpSpaces(ctxt);
    if (node->type != XML_ELEMENT_DECL) {
      ctxt->errors = ctxt->errors + 1;
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = "Node is not an element declaration";
      uVar5 = 0x13a1;
LAB_0016755b:
      fprintf(pFVar3,"ERROR %d: %s",uVar5,pcVar8);
      return;
    }
    if (node->name == (xmlChar *)0x0) {
      ctxt->errors = ctxt->errors + 1;
      fprintf((FILE *)ctxt->output,"ERROR %d: %s",0x1397,"Element declaration has no name");
    }
    else if (ctxt->check == 0) {
      fwrite("ELEMDECL(",9,1,(FILE *)ctxt->output);
      xmlCtxtDumpString(ctxt,node->name);
      fputc(0x29,(FILE *)ctxt->output);
    }
    if (ctxt->check != 0) goto LAB_00167a4e;
    switch(*(undefined4 *)&node->ns) {
    case 0:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = ", UNDEFINED";
      sVar7 = 0xb;
      break;
    case 1:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = ", EMPTY";
      sVar7 = 7;
      break;
    case 2:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = ", ANY";
      sVar7 = 5;
      break;
    case 3:
    case 4:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = ", MIXED ";
      sVar7 = 8;
      break;
    default:
      goto switchD_00167665_default;
    }
    fwrite(pcVar8,sVar7,1,pFVar3);
switchD_00167665_default:
    if ((node->type != XML_ELEMENT_NODE) &&
       ((xmlElementContentPtr)node->content != (xmlElementContentPtr)0x0)) {
      local_13c8[0] = '\0';
      xmlSnprintfElementContent(local_13c8,5000,(xmlElementContentPtr)node->content,1);
      local_40 = 0;
      fputs(local_13c8,(FILE *)ctxt->output);
    }
    fputc(10,(FILE *)ctxt->output);
LAB_00167a4e:
    xmlCtxtGenericNodeCheck(ctxt,node);
    return;
  case XML_ATTRIBUTE_DECL:
    xmlCtxtDumpSpaces(ctxt);
    if (node->type != XML_ATTRIBUTE_DECL) {
      ctxt->errors = ctxt->errors + 1;
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = "Node is not an attribute declaration";
      uVar5 = 0x13a0;
      goto LAB_0016755b;
    }
    if (node->name == (xmlChar *)0x0) {
      ctxt->errors = ctxt->errors + 1;
      fprintf((FILE *)ctxt->output,"ERROR %d: %s",0x1397,"Node attribute declaration has no name");
    }
    else if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output,"ATTRDECL(%s)");
    }
    lVar1._0_2_ = node->line;
    lVar1._2_2_ = node->extra;
    lVar1._4_4_ = *(undefined4 *)&node->field_0x74;
    if (lVar1 == 0) {
      ctxt->errors = ctxt->errors + 1;
      fprintf((FILE *)ctxt->output,"ERROR %d: %s",0x1398,
              "Node attribute declaration has no element name");
    }
    else if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output," for %s");
    }
    if (ctxt->check != 0) goto LAB_0016797c;
    switch(*(undefined4 *)&node->content) {
    case 1:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = " CDATA";
      goto LAB_00167b8b;
    case 2:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = " ID";
      sVar7 = 3;
      break;
    case 3:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = " IDREF";
LAB_00167b8b:
      sVar7 = 6;
      break;
    case 4:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = " IDREFS";
      goto LAB_00167b9c;
    case 5:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = " ENTITY";
LAB_00167b9c:
      sVar7 = 7;
      break;
    case 6:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = " ENTITIES";
      goto LAB_00167bca;
    case 7:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = " NMTOKEN";
      sVar7 = 8;
      break;
    case 8:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = " NMTOKENS";
LAB_00167bca:
      sVar7 = 9;
      break;
    case 9:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = " ENUMERATION";
      sVar7 = 0xc;
      break;
    case 10:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = " NOTATION ";
      sVar7 = 10;
      break;
    default:
      goto switchD_00167608_default;
    }
    fwrite(pcVar8,sVar7,1,pFVar3);
switchD_00167608_default:
    pxVar10 = node->nsDef;
    if (pxVar10 != (xmlNs *)0x0) {
      iVar6 = 5;
      do {
        pcVar8 = "|%s";
        if (iVar6 == 5) {
          pcVar8 = " (%s";
        }
        fprintf((FILE *)ctxt->output,pcVar8,*(undefined8 *)&pxVar10->type);
        pxVar10 = pxVar10->next;
        if (pxVar10 == (_xmlNs *)0x0) {
          fputc(0x29,(FILE *)ctxt->output);
          goto LAB_00167c63;
        }
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      fwrite("...)",4,1,(FILE *)ctxt->output);
    }
LAB_00167c63:
    iVar6 = *(int *)((long)&node->content + 4);
    if (iVar6 == 4) {
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = " FIXED";
      sVar7 = 6;
LAB_00167ca7:
      fwrite(pcVar8,sVar7,1,pFVar3);
    }
    else {
      if (iVar6 == 3) {
        pFVar3 = (FILE *)ctxt->output;
        pcVar8 = " IMPLIED";
        sVar7 = 8;
        goto LAB_00167ca7;
      }
      if (iVar6 == 2) {
        pFVar3 = (FILE *)ctxt->output;
        pcVar8 = " REQUIRED";
        sVar7 = 9;
        goto LAB_00167ca7;
      }
    }
    if (node->properties != (_xmlAttr *)0x0) {
      fputc(0x22,(FILE *)ctxt->output);
      xmlCtxtDumpString(ctxt,(xmlChar *)node->properties);
      fputc(0x22,(FILE *)ctxt->output);
    }
LAB_00167cde:
    fputc(10,(FILE *)ctxt->output);
    goto LAB_0016797c;
  case XML_ENTITY_DECL:
    xmlCtxtDumpSpaces(ctxt);
    if (node->type != XML_ENTITY_DECL) {
      ctxt->errors = ctxt->errors + 1;
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = "Node is not an entity declaration";
      uVar5 = 0x13a2;
      goto LAB_0016755b;
    }
    if (node->name == (xmlChar *)0x0) {
      ctxt->errors = ctxt->errors + 1;
      fprintf((FILE *)ctxt->output,"ERROR %d: %s",0x1397,"Entity declaration has no name");
    }
    else if (ctxt->check == 0) {
      fwrite("ENTITYDECL(",0xb,1,(FILE *)ctxt->output);
      xmlCtxtDumpString(ctxt,node->name);
      fputc(0x29,(FILE *)ctxt->output);
    }
    if (ctxt->check != 0) goto LAB_0016797c;
    switch(*(undefined4 *)((long)&node->properties + 4)) {
    case 1:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = ", internal\n";
      goto LAB_00167a79;
    case 2:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = ", external parsed\n";
      sVar7 = 0x12;
      break;
    case 3:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = ", unparsed\n";
LAB_00167a79:
      sVar7 = 0xb;
      break;
    case 4:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = ", parameter\n";
      sVar7 = 0xc;
      break;
    case 5:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = ", external parameter\n";
      sVar7 = 0x15;
      break;
    case 6:
      pFVar3 = (FILE *)ctxt->output;
      pcVar8 = ", predefined\n";
      sVar7 = 0xd;
      break;
    default:
      goto switchD_001676c8_default;
    }
    fwrite(pcVar8,sVar7,1,pFVar3);
switchD_001676c8_default:
    if (node->nsDef != (xmlNs *)0x0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output," ExternalID=%s\n",node->nsDef);
    }
    if (node->psvi != (void *)0x0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output," SystemID=%s\n",node->psvi);
    }
    if (node[1]._private != (void *)0x0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output," URI=%s\n",node[1]._private);
    }
    if (node->content == (xmlChar *)0x0) goto LAB_0016797c;
    xmlCtxtDumpSpaces(ctxt);
    fwrite(" content=",9,1,(FILE *)ctxt->output);
    xmlCtxtDumpString(ctxt,node->content);
    goto LAB_00167cde;
  case XML_NAMESPACE_DECL:
    xmlCtxtDumpNamespace(ctxt,(xmlNsPtr)node);
    return;
  case XML_XINCLUDE_START:
    if (ctxt->check != 0) {
      return;
    }
    xmlCtxtDumpSpaces(ctxt);
    pFVar3 = (FILE *)ctxt->output;
    pcVar8 = "INCLUDE START\n";
    sVar7 = 0xe;
    goto LAB_001670e8;
  case XML_XINCLUDE_END:
    if (ctxt->check != 0) {
      return;
    }
    xmlCtxtDumpSpaces(ctxt);
    pFVar3 = (FILE *)ctxt->output;
    pcVar8 = "INCLUDE END\n";
    sVar7 = 0xc;
LAB_001670e8:
    fwrite(pcVar8,sVar7,1,pFVar3);
    return;
  default:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      xVar9 = node->type;
    }
    ctxt->errors = ctxt->errors + 1;
    fprintf((FILE *)ctxt->output,"ERROR %d: ",0x1393);
    fprintf((FILE *)ctxt->output,"Unknown node type %d\n",(ulong)xVar9);
    return;
  }
  if (node->doc == (_xmlDoc *)0x0) {
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    fwrite("PBM: doc == NULL !!!\n",0x15,1,(FILE *)ctxt->output);
  }
  ctxt->depth = ctxt->depth + 1;
  xVar9 = node->type;
  if (xVar9 == XML_ELEMENT_NODE) {
    pxVar10 = node->nsDef;
    if (pxVar10 != (xmlNs *)0x0) {
      do {
        xmlCtxtDumpNamespace(ctxt,pxVar10);
        pxVar10 = pxVar10->next;
      } while (pxVar10 != (_xmlNs *)0x0);
      xVar9 = node->type;
      if (xVar9 != XML_ELEMENT_NODE) goto LAB_00167790;
    }
    attr = node->properties;
    if (attr != (_xmlAttr *)0x0) {
      do {
        xmlCtxtDumpAttr(ctxt,attr);
        attr = attr->next;
      } while (attr != (_xmlAttr *)0x0);
      xVar9 = node->type;
      goto LAB_00167790;
    }
    goto LAB_00167979;
  }
LAB_00167790:
  if (xVar9 == XML_ELEMENT_NODE) goto LAB_00167979;
  if (xVar9 != XML_ENTITY_REF_NODE) {
    if ((node->content == (xmlChar *)0x0) || (ctxt->check != 0)) goto LAB_00167979;
    xmlCtxtDumpSpaces(ctxt);
    fwrite("content=",8,1,(FILE *)ctxt->output);
    pxVar4 = node->content;
    goto LAB_00167964;
  }
  pxVar2 = xmlGetDocEntity(node->doc,node->name);
  if ((pxVar2 == (xmlEntityPtr)0x0) || (xmlCtxtDumpSpaces(ctxt), ctxt->check != 0))
  goto LAB_00167979;
  switch(pxVar2->etype) {
  case XML_INTERNAL_GENERAL_ENTITY:
    pcVar8 = "INTERNAL_GENERAL_ENTITY ";
    sVar7 = 0x18;
    break;
  case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
    pcVar8 = "EXTERNAL_GENERAL_PARSED_ENTITY ";
    sVar7 = 0x1f;
    break;
  case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
    pcVar8 = "EXTERNAL_GENERAL_UNPARSED_ENTITY ";
    sVar7 = 0x21;
    break;
  case XML_INTERNAL_PARAMETER_ENTITY:
    pcVar8 = "INTERNAL_PARAMETER_ENTITY ";
    goto LAB_0016789a;
  case XML_EXTERNAL_PARAMETER_ENTITY:
    pcVar8 = "EXTERNAL_PARAMETER_ENTITY ";
LAB_0016789a:
    sVar7 = 0x1a;
    break;
  default:
    fprintf((FILE *)ctxt->output,"ENTITY_%d ! ");
    goto LAB_001678b7;
  }
  fwrite(pcVar8,sVar7,1,(FILE *)ctxt->output);
LAB_001678b7:
  fprintf((FILE *)ctxt->output,"%s\n",pxVar2->name);
  if (pxVar2->ExternalID != (xmlChar *)0x0) {
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"ExternalID=%s\n",pxVar2->ExternalID);
  }
  if (pxVar2->SystemID != (xmlChar *)0x0) {
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"SystemID=%s\n",pxVar2->SystemID);
  }
  if (pxVar2->URI != (xmlChar *)0x0) {
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"URI=%s\n",pxVar2->URI);
  }
  if (pxVar2->content != (xmlChar *)0x0) {
    xmlCtxtDumpSpaces(ctxt);
    fwrite("content=",8,1,(FILE *)ctxt->output);
    pxVar4 = pxVar2->content;
LAB_00167964:
    xmlCtxtDumpString(ctxt,pxVar4);
    fputc(10,(FILE *)ctxt->output);
  }
LAB_00167979:
  ctxt->depth = ctxt->depth + -1;
LAB_0016797c:
  xmlCtxtGenericNodeCheck(ctxt,node);
  return;
}

Assistant:

static void
xmlCtxtDumpOneNode(xmlDebugCtxtPtr ctxt, xmlNodePtr node)
{
    if (node == NULL) {
        if (!ctxt->check) {
            xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, "node is NULL\n");
        }
        return;
    }
    ctxt->node = node;

    switch (node->type) {
        case XML_ELEMENT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "ELEMENT ");
                if ((node->ns != NULL) && (node->ns->prefix != NULL)) {
                    xmlCtxtDumpString(ctxt, node->ns->prefix);
                    fprintf(ctxt->output, ":");
                }
                xmlCtxtDumpString(ctxt, node->name);
                fprintf(ctxt->output, "\n");
            }
            break;
        case XML_ATTRIBUTE_NODE:
            if (!ctxt->check)
                xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, "Error, ATTRIBUTE found here\n");
            xmlCtxtGenericNodeCheck(ctxt, node);
            return;
        case XML_TEXT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                if (node->name == (const xmlChar *) xmlStringTextNoenc)
                    fprintf(ctxt->output, "TEXT no enc");
                else
                    fprintf(ctxt->output, "TEXT");
		if (ctxt->options & DUMP_TEXT_TYPE) {
		    if (node->content == (xmlChar *) &(node->properties))
			fprintf(ctxt->output, " compact\n");
		    else if (xmlDictOwns(ctxt->dict, node->content) == 1)
			fprintf(ctxt->output, " interned\n");
		    else
			fprintf(ctxt->output, "\n");
		} else
		    fprintf(ctxt->output, "\n");
            }
            break;
        case XML_CDATA_SECTION_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "CDATA_SECTION\n");
            }
            break;
        case XML_ENTITY_REF_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "ENTITY_REF(%s)\n",
                        (char *) node->name);
            }
            break;
        case XML_ENTITY_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "ENTITY\n");
            }
            break;
        case XML_PI_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "PI %s\n", (char *) node->name);
            }
            break;
        case XML_COMMENT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "COMMENT\n");
            }
            break;
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
            }
            fprintf(ctxt->output, "Error, DOCUMENT found here\n");
            xmlCtxtGenericNodeCheck(ctxt, node);
            return;
        case XML_DOCUMENT_TYPE_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "DOCUMENT_TYPE\n");
            }
            break;
        case XML_DOCUMENT_FRAG_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "DOCUMENT_FRAG\n");
            }
            break;
        case XML_NOTATION_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "NOTATION\n");
            }
            break;
        case XML_DTD_NODE:
            xmlCtxtDumpDtdNode(ctxt, (xmlDtdPtr) node);
            return;
        case XML_ELEMENT_DECL:
            xmlCtxtDumpElemDecl(ctxt, (xmlElementPtr) node);
            return;
        case XML_ATTRIBUTE_DECL:
            xmlCtxtDumpAttrDecl(ctxt, (xmlAttributePtr) node);
            return;
        case XML_ENTITY_DECL:
            xmlCtxtDumpEntityDecl(ctxt, (xmlEntityPtr) node);
            return;
        case XML_NAMESPACE_DECL:
            xmlCtxtDumpNamespace(ctxt, (xmlNsPtr) node);
            return;
        case XML_XINCLUDE_START:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "INCLUDE START\n");
            }
            return;
        case XML_XINCLUDE_END:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "INCLUDE END\n");
            }
            return;
        default:
            if (!ctxt->check)
                xmlCtxtDumpSpaces(ctxt);
	    xmlDebugErr2(ctxt, XML_CHECK_UNKNOWN_NODE,
	                "Unknown node type %d\n", node->type);
            return;
    }
    if (node->doc == NULL) {
        if (!ctxt->check) {
            xmlCtxtDumpSpaces(ctxt);
        }
        fprintf(ctxt->output, "PBM: doc == NULL !!!\n");
    }
    ctxt->depth++;
    if ((node->type == XML_ELEMENT_NODE) && (node->nsDef != NULL))
        xmlCtxtDumpNamespaceList(ctxt, node->nsDef);
    if ((node->type == XML_ELEMENT_NODE) && (node->properties != NULL))
        xmlCtxtDumpAttrList(ctxt, node->properties);
    if (node->type != XML_ENTITY_REF_NODE) {
        if ((node->type != XML_ELEMENT_NODE) && (node->content != NULL)) {
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "content=");
                xmlCtxtDumpString(ctxt, node->content);
                fprintf(ctxt->output, "\n");
            }
        }
    } else {
        xmlEntityPtr ent;

        ent = xmlGetDocEntity(node->doc, node->name);
        if (ent != NULL)
            xmlCtxtDumpEntity(ctxt, ent);
    }
    ctxt->depth--;

    /*
     * Do a bit of checking
     */
    xmlCtxtGenericNodeCheck(ctxt, node);
}